

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhostaddress.cpp
# Opt level: O1

void __thiscall QHostAddress::setAddress(QHostAddress *this,quint32 ip4Addr)

{
  QHostAddressPrivate *pQVar1;
  
  pQVar1 = (this->d).d.ptr;
  if ((pQVar1 != (QHostAddressPrivate *)0x0) &&
     ((__atomic_base<int>)
      *(__int_type *)
       &(pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value != (__atomic_base<int>)0x1)) {
    QExplicitlySharedDataPointer<QHostAddressPrivate>::detach_helper(&this->d);
  }
  pQVar1 = (this->d).d.ptr;
  pQVar1->a = ip4Addr;
  pQVar1->protocol = '\0';
  (pQVar1->field_1).a6_64.c[0] = 0;
  if (ip4Addr == 0) {
    (pQVar1->field_1).a6_64.c[1] = 0;
  }
  else {
    (pQVar1->field_1).a6_32.c[2] = 0xffff0000;
    (pQVar1->field_1).a6_32.c[3] =
         ip4Addr >> 0x18 | (ip4Addr & 0xff0000) >> 8 | (ip4Addr & 0xff00) << 8 | ip4Addr << 0x18;
  }
  return;
}

Assistant:

void QHostAddress::setAddress(quint32 ip4Addr)
{
    d.detach();
    d->setAddress(ip4Addr);
}